

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O2

FilenameBuilder * __thiscall
GOESRProduct::getFilenameBuilder
          (FilenameBuilder *__return_storage_ptr__,GOESRProduct *this,Handler *config)

{
  __syscall_slong_t _Var1;
  string sStack_68;
  AnnotationHeader local_48;
  
  FilenameBuilder::FilenameBuilder(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  getHeader<lrit::AnnotationHeader>(&local_48,this);
  removeSuffix(&sStack_68,&local_48.text);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->filename,(string *)&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48.text);
  _Var1 = (this->frameStart_).tv_nsec;
  (__return_storage_ptr__->time).tv_sec = (this->frameStart_).tv_sec;
  (__return_storage_ptr__->time).tv_nsec = _Var1;
  Product::operator=(&__return_storage_ptr__->product,&this->product_);
  Region::operator=(&__return_storage_ptr__->region,&this->region_);
  Channel::operator=(&__return_storage_ptr__->channel,&this->channel_);
  return __return_storage_ptr__;
}

Assistant:

FilenameBuilder GOESRProduct::getFilenameBuilder(const Config::Handler& config) const {
  FilenameBuilder fb;
  fb.dir = config.dir;
  fb.filename = removeSuffix(getHeader<lrit::AnnotationHeader>().text);
  fb.time = frameStart_;
  fb.product = product_;
  fb.region = region_;
  fb.channel = channel_;
  return fb;
}